

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  
  if (argc == 1) {
    main_repl(1,argv);
    if ((deci::nothing_t::Instance()::self == '\0') &&
       (iVar1 = __cxa_guard_acquire(&deci::nothing_t::Instance()::self), iVar1 != 0)) {
      deci::nothing_t::Instance::self.super_value_t.hash = 1;
      deci::nothing_t::Instance::self.super_value_t._vptr_value_t =
           (_func_int **)&PTR_DoHashing_0011ca50;
      __cxa_atexit(deci::nothing_t::~nothing_t,&deci::nothing_t::Instance::self,&__dso_handle);
      __cxa_guard_release(&deci::nothing_t::Instance()::self);
    }
    return 0x11e2b0;
  }
  lVar2 = 1;
  do {
    if (argc <= lVar2) {
      return 0;
    }
    iVar1 = run(argv[lVar2]);
    lVar2 = lVar2 + 1;
  } while (iVar1 == 0);
  return -1;
}

Assistant:

int main(int argc, char* argv[]) {

  if (argc == 1) {
    return main_repl(argc, argv);
  }

  for (int i = 1; i < argc; ++i) {
    if (run(argv[i]) != 0) {
      return -1;
    }
  }
  return 0;
}